

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O2

_Bool large_ralloc_no_move_expand(tsdn_t *tsdn,edata_t *edata,size_t usize,_Bool zero)

{
  uint uVar1;
  arena_t *paVar2;
  ulong uVar3;
  _Bool _Var4;
  szind_t szind;
  void *__s;
  size_t new_size;
  _Bool deferred_work_generated;
  size_t local_40;
  arena_t *local_38;
  
  uVar1 = (uint)edata->e_bits;
  paVar2 = (arena_t *)duckdb_je_arenas[uVar1 & 0xfff].repr;
  uVar3 = (edata->field_2).e_size_esn;
  local_40 = *(size_t *)((long)duckdb_je_sz_index2size_tab + (ulong)(uVar1 >> 0x11 & 0x7f8));
  new_size = duckdb_je_sz_large_pad + usize;
  if (usize < 0x1001) {
    szind = (szind_t)duckdb_je_sz_size2index_tab[usize + 7 >> 3];
  }
  else {
    szind = sz_size2index_compute(usize);
  }
  deferred_work_generated = false;
  local_38 = paVar2;
  _Var4 = duckdb_je_pa_expand(tsdn,&paVar2->pa_shard,edata,uVar3 & 0xfffffffffffff000,new_size,szind
                              ,zero,&deferred_work_generated);
  if (deferred_work_generated == true) {
    duckdb_je_arena_handle_deferred_work(tsdn,local_38);
  }
  if (!_Var4) {
    if ((zero) && (duckdb_je_opt_cache_oblivious == true)) {
      __s = (void *)((long)edata->e_addr + local_40);
      switchD_014c69ad::default(__s,0,0x1000 - (ulong)((int)__s + 0x1000U & 0xfff));
    }
    duckdb_je_arena_extent_ralloc_large_expand(tsdn,local_38,edata,local_40);
  }
  return _Var4;
}

Assistant:

static bool
large_ralloc_no_move_expand(tsdn_t *tsdn, edata_t *edata, size_t usize,
    bool zero) {
	arena_t *arena = arena_get_from_edata(edata);

	size_t old_size = edata_size_get(edata);
	size_t old_usize = edata_usize_get(edata);
	size_t new_size = usize + sz_large_pad;

	szind_t szind = sz_size2index(usize);

	bool deferred_work_generated = false;
	bool err = pa_expand(tsdn, &arena->pa_shard, edata, old_size, new_size,
	    szind, zero, &deferred_work_generated);

	if (deferred_work_generated) {
		arena_handle_deferred_work(tsdn, arena);
	}

	if (err) {
		return true;
	}

	if (zero) {
		if (opt_cache_oblivious) {
			assert(sz_large_pad == PAGE);
			/*
			 * Zero the trailing bytes of the original allocation's
			 * last page, since they are in an indeterminate state.
			 * There will always be trailing bytes, because ptr's
			 * offset from the beginning of the extent is a multiple
			 * of CACHELINE in [0 .. PAGE).
			 */
			void *zbase = (void *)
			    ((byte_t *)edata_addr_get(edata) + old_usize);
			void *zpast = PAGE_ADDR2BASE((void *)((byte_t *)zbase +
			    PAGE));
			size_t nzero = (byte_t *)zpast - (byte_t *)zbase;
			assert(nzero > 0);
			memset(zbase, 0, nzero);
		}
	}
	arena_extent_ralloc_large_expand(tsdn, arena, edata, old_usize);

	return false;
}